

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O1

int history_def_next(void *p,HistEvent_conflict *ev)

{
  undefined8 *puVar1;
  char *pcVar2;
  
  if (*(void **)((long)p + 0x28) == p) {
    ev->num = 5;
    pcVar2 = "empty list";
  }
  else {
    puVar1 = *(undefined8 **)((long)*(void **)((long)p + 0x28) + 0x18);
    if (puVar1 != (undefined8 *)p) {
      *(undefined8 **)((long)p + 0x28) = puVar1;
      pcVar2 = (char *)puVar1[1];
      *(undefined8 *)ev = *puVar1;
      ev->str = pcVar2;
      return 0;
    }
    ev->num = 6;
    pcVar2 = "no next event";
  }
  ev->str = pcVar2;
  return -1;
}

Assistant:

static int
history_def_next(void *p, TYPE(HistEvent) *ev)
{
	history_t *h = (history_t *) p;

	if (h->cursor == &h->list) {
		he_seterrev(ev, _HE_EMPTY_LIST);
		return -1;
	}

	if (h->cursor->next == &h->list) {
		he_seterrev(ev, _HE_END_REACHED);
		return -1;
	}

        h->cursor = h->cursor->next;
        *ev = h->cursor->ev;

	return 0;
}